

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_object.cpp
# Opt level: O0

uint32_t mjs::anon_unknown_35::string_cache::calc_hash(char *s)

{
  uint local_1c;
  uint32_t h;
  uint32_t offset;
  uint32_t prime;
  char *s_local;
  
  local_1c = 0x811c9dc5;
  for (_offset = (byte *)s; *_offset != 0; _offset = _offset + 1) {
    local_1c = local_1c * 0x1000193 ^ (uint)*_offset;
  }
  return local_1c;
}

Assistant:

static uint32_t calc_hash(const char* s) {
        // FNV
        constexpr uint32_t prime = 16777619;
        constexpr uint32_t offset = 2166136261;
        uint32_t h = offset;
        for (; *s; ++s) {
            h = (h*prime) ^ static_cast<uint8_t>(*s);
        }
        return h;
    }